

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString StringFromMaskedBits(unsigned_long value,unsigned_long mask,size_t byteCount)

{
  ulong in_RCX;
  ulong in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t sVar1;
  char *in_RDI;
  SimpleString SVar2;
  size_t i;
  unsigned_long msbMask;
  size_t bitCount;
  SimpleString *result;
  char *in_stack_ffffffffffffff88;
  SimpleString *in_stack_ffffffffffffff90;
  ulong local_68;
  SimpleString *in_stack_ffffffffffffffb0;
  ulong local_40;
  ulong local_18;
  
  SimpleString::SimpleString(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (in_RCX < 9) {
    local_68 = in_RCX << 3;
  }
  else {
    local_68 = 0x40;
  }
  sVar1 = extraout_RDX;
  local_18 = in_RDX;
  for (local_40 = 0; local_40 < local_68; local_40 = local_40 + 1) {
    if ((local_18 & 1L << ((char)local_68 - 1U & 0x3f)) == 0) {
      SimpleString::operator+=(in_stack_ffffffffffffffb0,in_RDI);
      sVar1 = extraout_RDX_01;
    }
    else {
      SimpleString::operator+=(in_stack_ffffffffffffffb0,in_RDI);
      sVar1 = extraout_RDX_00;
    }
    if (((local_40 & 7) == 7) && (local_40 != local_68 - 1)) {
      SimpleString::operator+=(in_stack_ffffffffffffffb0,in_RDI);
      sVar1 = extraout_RDX_02;
    }
    local_18 = local_18 << 1;
  }
  SVar2.bufferSize_ = sVar1;
  SVar2.buffer_ = in_RDI;
  return SVar2;
}

Assistant:

SimpleString StringFromMaskedBits(unsigned long value, unsigned long mask, size_t byteCount)
{
    SimpleString result;
    size_t bitCount = (byteCount > sizeof(unsigned long)) ? (sizeof(unsigned long) * CPPUTEST_CHAR_BIT) : (byteCount * CPPUTEST_CHAR_BIT);
    const unsigned long msbMask = (((unsigned long) 1) << (bitCount - 1));

    for (size_t i = 0; i < bitCount; i++) {
        if (mask & msbMask) {
            result += (value & msbMask) ? "1" : "0";
        }
        else {
            result += "x";
        }

        if (((i % 8) == 7) && (i != (bitCount - 1))) {
            result += " ";
        }

        value <<= 1;
        mask <<= 1;
    }

    return result;
}